

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * cfd::js::api::json::JsonMappingApi::CreatePegInAddress
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  *in_RCX;
  undefined1 local_28 [24];
  code *local_10;
  
  local_28._8_8_ = 0;
  local_28._0_8_ = ElementsAddressStructApi::CreatePegInAddress;
  local_10 = std::
             _Function_handler<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&),_cfd::js::api::CreatePegInAddressResponseStruct_(*)(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
             ::_M_invoke;
  local_28._16_8_ =
       std::
       _Function_handler<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&),_cfd::js::api::CreatePegInAddressResponseStruct_(*)(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
       ::_M_manager;
  ExecuteJsonApi<cfd::js::api::json::CreatePegInAddressRequest,cfd::js::api::json::CreatePegInAddressResponse,cfd::js::api::CreatePegInAddressRequestStruct,cfd::js::api::CreatePegInAddressResponseStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::CreatePegInAddress(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::CreatePegInAddressRequest,
      api::json::CreatePegInAddressResponse,
      api::CreatePegInAddressRequestStruct,
      api::CreatePegInAddressResponseStruct>(
      request_message, ElementsAddressStructApi::CreatePegInAddress);
}